

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

int objisd(mcmcxdef *ctx,objdef *objptr,objnum parentnum)

{
  ushort uVar1;
  mcmon objnum;
  int iVar2;
  uchar *objptr_00;
  long lVar3;
  uint local_40;
  
  uVar1 = *(ushort *)(objptr + 4);
  if (uVar1 != 0) {
    lVar3 = 0;
    do {
      objnum = *(mcmon *)(objptr + lVar3 * 2 + 0xe);
      if (objnum == parentnum) {
        return 1;
      }
      objptr_00 = mcmlck(ctx,objnum);
      iVar2 = objisd(ctx,objptr_00,parentnum);
      mcmunlck(ctx,objnum);
      if (iVar2 != 0) {
        return 1;
      }
      lVar3 = lVar3 + 1;
      local_40 = (uint)uVar1;
    } while (local_40 != (uint)lVar3);
  }
  return 0;
}

Assistant:

static int objisd(mcmcxdef *ctx, objdef *objptr, objnum parentnum)
{
    uchar *sc;
    int    cnt;
    
    for (sc = objsc(objptr), cnt = objnsc(objptr) ; cnt ;
         sc += 2, --cnt)
    {
        int     cursc = osrp2(sc);
        int     ret;
        objdef *curptr;
        
        if (cursc == parentnum) return(TRUE);
        
        curptr = (objdef *)mcmlck(ctx, (mcmon)cursc);
        ret = objisd(ctx, curptr, parentnum);
        mcmunlck(ctx, (mcmon)cursc);
        if (ret) return(TRUE);
    }
    return(FALSE);
}